

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int fits_clean_url(char *inURL,char *outURL,int *status)

{
  size_t sVar1;
  grp_stack_item_struct *__ptr;
  grp_stack_item_struct *pgVar2;
  grp_stack *pgVar3;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  grp_stack *mystack;
  grp_stack *local_40;
  int *local_38;
  
  if (*status != 0) {
    return *status;
  }
  local_40 = (grp_stack *)malloc(0x10);
  if (local_40 != (grp_stack *)0x0) {
    local_40->stack_size = 0;
    local_40->top = (grp_stack_item *)0x0;
  }
  *outURL = '\0';
  pcVar6 = strstr(inURL,"://");
  piVar4 = status;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = strchr(pcVar6 + 3,0x2f);
    if (pcVar6 == (char *)0x0) {
      strcpy(outURL,inURL);
      goto LAB_00173fa7;
    }
    local_38 = status;
    strncpy(outURL,inURL,(long)pcVar6 - (long)inURL);
    outURL[(long)pcVar6 - (long)inURL] = '\0';
    inURL = pcVar6;
    piVar4 = local_38;
  }
  local_38 = piVar4;
  if (*inURL == '/') {
    sVar7 = strlen(outURL);
    (outURL + sVar7)[0] = '/';
    (outURL + sVar7)[1] = '\0';
  }
  pcVar6 = strtok(inURL,"/");
  status = local_38;
  while (local_38 = status, pcVar6 != (char *)0x0) {
    iVar5 = strcmp(pcVar6,"..");
    if (iVar5 == 0) {
      if (local_40->stack_size == 0) {
        if (*inURL != '/') goto LAB_00173eb4;
      }
      else {
        pop_grp_stack(local_40);
      }
    }
    else {
      iVar5 = strcmp(pcVar6,".");
      if (iVar5 != 0) {
LAB_00173eb4:
        push_grp_stack(local_40,pcVar6);
      }
    }
    pcVar6 = strtok((char *)0x0,"/");
    status = local_38;
  }
  sVar1 = local_40->stack_size;
  pgVar3 = local_40;
  while (local_40 = pgVar3, sVar1 != 0) {
    __ptr = pgVar3->top->next;
    pcVar6 = __ptr->data;
    pgVar2 = __ptr->prev;
    pgVar2->next = __ptr->next;
    __ptr->next->prev = pgVar2;
    free(__ptr);
    pgVar3->stack_size = pgVar3->stack_size - 1;
    if (pgVar3->stack_size == 0) {
      pgVar3->top = (grp_stack_item *)0x0;
    }
    sVar7 = strlen(outURL);
    sVar8 = strlen(pcVar6);
    if ((sVar8 + sVar7) - 0x400 < 0xfffffffffffffbff) {
      *outURL = '\0';
      ffpmsg("outURL is too long (fits_clean_url)");
      *status = 0x7d;
      goto LAB_00173fa7;
    }
    strcat(outURL,pcVar6);
    sVar7 = strlen(outURL);
    (outURL + sVar7)[0] = '/';
    (outURL + sVar7)[1] = '\0';
    pgVar3 = local_40;
    sVar1 = local_40->stack_size;
  }
  sVar7 = strlen(outURL);
  outURL[sVar7 - 1] = '\0';
LAB_00173fa7:
  delete_grp_stack(&local_40);
  return *status;
}

Assistant:

int fits_clean_url(char *inURL,  /* I input URL string                      */
		   char *outURL, /* O output URL string                     */
		   int  *status)
/*
  clean the URL by eliminating any ".." or "." specifiers in the inURL
  string, and write the output to the outURL string.

  Note that this function must have a valid Unix-style URL as input; platform
  dependent path strings are not allowed.
 */
{
  grp_stack* mystack; /* stack to hold pieces of URL */
  char* tmp;
  char *saveptr;

  if(*status) return *status;

  mystack = new_grp_stack();
  *outURL = 0;

  do {
    /* handle URL scheme and domain if they exist */
    tmp = strstr(inURL, "://");
    if(tmp) {
      /* there is a URL scheme, so look for the end of the domain too */
      tmp = strchr(tmp + 3, '/');
      if(tmp) {
        /* tmp is now the end of the domain, so
         * copy URL scheme and domain as is, and terminate by hand */
        size_t string_size = (size_t) (tmp - inURL);
        strncpy(outURL, inURL, string_size);
        outURL[string_size] = 0;

        /* now advance the input pointer to just after the domain and go on */
        inURL = tmp;
      } else {
        /* '/' was not found, which means there are no path-like
         * portions, so copy whole inURL to outURL and we're done */
        strcpy(outURL, inURL);
        continue; /* while(0) */
      }
    }

    /* explicitly copy a leading / (absolute path) */
    if('/' == *inURL) strcat(outURL, "/");

    /* now clean the remainder of the inURL. push URL segments onto
     * stack, dealing with .. and . as we go */
    tmp = ffstrtok(inURL, "/",&saveptr); /* finds first / */
    while(tmp) {
      if(!strcmp(tmp, "..")) {
        /* discard previous URL segment, if there was one. if not,
         * add the .. to the stack if this is *not* an absolute path
         * (for absolute paths, leading .. has no effect, so skip it) */
        if(0 < mystack->stack_size) pop_grp_stack(mystack);
        else if('/' != *inURL) push_grp_stack(mystack, tmp);
      } else {
        /* always just skip ., but otherwise add segment to stack */
        if(strcmp(tmp, ".")) push_grp_stack(mystack, tmp);
      }
      tmp = ffstrtok(NULL, "/",&saveptr); /* get the next segment */
    }

    /* stack now has pieces of cleaned URL, so just catenate them
     * onto output string until stack is empty */
    while(0 < mystack->stack_size) {
      tmp = shift_grp_stack(mystack);
      if (strlen(outURL) + strlen(tmp) + 1 > FLEN_FILENAME-1)
      {
         outURL[0]=0;
         ffpmsg("outURL is too long (fits_clean_url)");
         *status = URL_PARSE_ERROR;
         delete_grp_stack(&mystack);
         return *status;         
      }
      strcat(outURL, tmp);
      strcat(outURL, "/");
    }
    outURL[strlen(outURL) - 1] = 0; /* blank out trailing / */
  } while(0);
  delete_grp_stack(&mystack);
  return *status;
}